

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::timestamp_t,_double> *state,timestamp_t *x,double *y,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  bool bVar2;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    Execute<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>>
              (state,(timestamp_t)x->value,*y,binary);
    return;
  }
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) &&
     ((puVar1[binary->ridx >> 6] >> (binary->ridx & 0x3f) & 1) == 0)) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    bVar2 = (puVar1[binary->lidx >> 6] >> (binary->lidx & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar2;
    if (bVar2) goto LAB_018796fb;
  }
  (state->arg).value = x->value;
LAB_018796fb:
  state->value = *y;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}